

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makePointer(TranslateToFuzzReader *this)

{
  uint32_t uVar1;
  Expression *pEVar2;
  Const *pCVar3;
  Expression *pEVar4;
  Id IVar5;
  Builder *this_00;
  
  pEVar2 = make(this,(Type)*(uintptr_t *)
                            ((long)(((this->wasm->memories).
                                     super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                            + 0x50));
  if ((this->allowOOB == true) && (uVar1 = Random::upTo(&this->random,10), uVar1 == 0)) {
    return pEVar2;
  }
  this_00 = &this->builder;
  if (*(long *)((long)(((this->wasm->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x50
               ) == 3) {
    pCVar3 = Builder::makeConst<long>(this_00,0xf);
    IVar5 = SIMDTernaryId;
  }
  else {
    pCVar3 = Builder::makeConst<int>(this_00,0xf);
    IVar5 = CallIndirectId;
  }
  pEVar4 = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x28,8);
  pEVar4->_id = BinaryId;
  (pEVar4->type).id = 0;
  pEVar4[1]._id = IVar5;
  pEVar4[1].type.id = (uintptr_t)pEVar2;
  *(Const **)(pEVar4 + 2) = pCVar3;
  ::wasm::Binary::finalize();
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makePointer() {
  auto* ret = make(wasm.memories[0]->indexType);
  // with high probability, mask the pointer so it's in a reasonable
  // range. otherwise, most pointers are going to be out of range and
  // most memory ops will just trap
  if (!allowOOB || !oneIn(10)) {
    if (wasm.memories[0]->is64()) {
      ret = builder.makeBinary(
        AndInt64, ret, builder.makeConst(int64_t(USABLE_MEMORY - 1)));
    } else {
      ret = builder.makeBinary(
        AndInt32, ret, builder.makeConst(int32_t(USABLE_MEMORY - 1)));
    }
  }
  return ret;
}